

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_derived_from_or_self
              (lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  lyd_node *plVar1;
  lys_node *plVar2;
  int iVar3;
  char *pcVar4;
  lys_node_leaf *sleaf;
  lyd_node_leaf_list *leaf;
  uint16_t j;
  uint16_t i;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t UNUSED_arg_count_local;
  lyxp_set **args_local;
  
  if (((*args)->type == LYXP_SET_NODE_SET) || ((*args)->type == LYXP_SET_EMPTY)) {
    iVar3 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar3 == 0) {
      set_fill_boolean(set,0);
      if ((*args)->type != LYXP_SET_EMPTY) {
        for (leaf._2_2_ = 0; (uint)leaf._2_2_ < (*args)->used; leaf._2_2_ = leaf._2_2_ + 1) {
          plVar1 = ((*args)->val).nodes[leaf._2_2_].node;
          plVar2 = plVar1->schema;
          if (((plVar2->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
             (iVar3._0_2_ = plVar2[1].flags, iVar3._2_1_ = plVar2[1].ext_size,
             iVar3._3_1_ = plVar2[1].iffeature_size, iVar3 == 7)) {
            iVar3 = xpath_derived_from_ident_cmp((lys_ident *)plVar1[1].schema,(args[1]->val).str);
            if (iVar3 == 0) {
              set_fill_boolean(set,1);
              break;
            }
            for (leaf._0_2_ = 0; (ushort)leaf < (plVar1[1].schema)->padding[3];
                leaf._0_2_ = (ushort)leaf + 1) {
              iVar3 = xpath_derived_from_ident_cmp
                                (*(lys_ident **)
                                  (*(long *)&(plVar1[1].schema)->nodetype + (ulong)(ushort)leaf * 8)
                                 ,(args[1]->val).str);
              if (iVar3 == 0) {
                set_fill_boolean(set,1);
                break;
              }
            }
            if ((ushort)leaf < (plVar1[1].schema)->padding[3]) break;
          }
        }
      }
      args_local._4_4_ = 0;
    }
    else {
      args_local._4_4_ = -1;
    }
  }
  else {
    pcVar4 = print_set_type(*args);
    ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar4,
            "derived-from-or-self(node-set, string)");
    args_local._4_4_ = -1;
  }
  return args_local._4_4_;
}

Assistant:

static int
xpath_derived_from_or_self(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node,
                           struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    uint16_t i, j;
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "derived-from-or-self(node-set, string)");
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    set_fill_boolean(set, 0);
    if (args[0]->type != LYXP_SET_EMPTY) {
        for (i = 0; i < args[0]->used; ++i) {
            leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[i].node;
            sleaf = (struct lys_node_leaf *)leaf->schema;
            if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && (sleaf->type.base == LY_TYPE_IDENT)) {
                if (!xpath_derived_from_ident_cmp(leaf->value.ident, args[1]->val.str)) {
                    set_fill_boolean(set, 1);
                    break;
                }

                for (j = 0; j < leaf->value.ident->base_size; ++j) {
                    if (!xpath_derived_from_ident_cmp(leaf->value.ident->base[j], args[1]->val.str)) {
                        set_fill_boolean(set, 1);
                        break;
                    }
                }

                if (j < leaf->value.ident->base_size) {
                    break;
                }
            }
        }
    }

    return EXIT_SUCCESS;
}